

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_socket_connect(ENetSocket socket,ENetAddress *address)

{
  int *piVar1;
  undefined1 local_38 [8];
  sockaddr_in6 sin;
  int result;
  ENetAddress *address_local;
  ENetSocket socket_local;
  
  sin.sin6_addr.__in6_u.__u6_addr32[3] = 0xffffffff;
  unique0x10000096 = address;
  memset(local_38,0,0x1c);
  local_38._0_2_ = 10;
  local_38._2_2_ = htons(stack0xffffffffffffffe8->port);
  sin._0_8_ = *(undefined8 *)&stack0xffffffffffffffe8->field_0;
  sin.sin6_addr.__in6_u._0_8_ = *(undefined8 *)((long)&stack0xffffffffffffffe8->field_0 + 8);
  sin.sin6_addr.__in6_u.__u6_addr32[3] = connect(socket,(sockaddr *)local_38,0x1c);
  if ((sin.sin6_addr.__in6_u.__u6_addr32[3] == 0xffffffff) &&
     (piVar1 = __errno_location(), *piVar1 == 0x73)) {
    return 0;
  }
  return sin.sin6_addr.__in6_u.__u6_addr32[3];
}

Assistant:

int enet_socket_connect(ENetSocket socket, const ENetAddress* address) {
	int result = -1;
	struct sockaddr_in6 sin;

	memset(&sin, 0, sizeof(struct sockaddr_in6));

	sin.sin6_family = AF_INET6;
	sin.sin6_port = ENET_HOST_TO_NET_16(address->port);
	sin.sin6_addr = address->ipv6;

	result = connect(socket, (struct sockaddr*)&sin, sizeof(struct sockaddr_in6));

	if (result == -1 && errno == EINPROGRESS)
		return 0;

	return result;
}